

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MultiIterNextFrom(Fts5Index *p,Fts5Iter *pIter,i64 iMatch)

{
  int iVar1;
  i64 iVar2;
  long in_RDX;
  Fts5Iter *in_RSI;
  Fts5Index *in_RDI;
  i64 iRowid;
  
  while( true ) {
    fts5MultiIterNext(in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),-0x5555555555555556);
    iVar1 = fts5MultiIterEof(in_RDI,in_RSI);
    if (iVar1 != 0) {
      return;
    }
    iVar2 = fts5MultiIterRowid(in_RSI);
    if ((in_RSI->bRev == 0) && (in_RDX <= iVar2)) break;
    if ((in_RSI->bRev != 0) && (iVar2 <= in_RDX)) {
      return;
    }
  }
  return;
}

Assistant:

static void fts5MultiIterNextFrom(
  Fts5Index *p,
  Fts5Iter *pIter,
  i64 iMatch
){
  while( 1 ){
    i64 iRowid;
    fts5MultiIterNext(p, pIter, 1, iMatch);
    if( fts5MultiIterEof(p, pIter) ) break;
    iRowid = fts5MultiIterRowid(pIter);
    if( pIter->bRev==0 && iRowid>=iMatch ) break;
    if( pIter->bRev!=0 && iRowid<=iMatch ) break;
  }
}